

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O0

void __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(cache<uint256,_SignatureCacheHasher> *this)

{
  long lVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  uint32_t in_stack_0000003c;
  bit_packed_atomic_flags *in_stack_00000040;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffffc8);
  *(undefined4 *)(in_RDI + 3) = 0;
  bit_packed_atomic_flags::bit_packed_atomic_flags(in_stack_00000040,in_stack_0000003c);
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[9] = 0;
  std::vector<bool,_std::allocator<bool>_>::vector(in_stack_ffffffffffffffc8);
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  *(undefined1 *)(in_RDI + 0xb) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

cache() : table(), collection_flags(0), epoch_flags(), hash_function()
    {
    }